

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1M2L<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  size_type sVar25;
  ostream *this;
  reference pvVar26;
  reference pvVar27;
  reference pvVar28;
  MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *pMVar29;
  Scalar *pSVar30;
  Scalar *pSVar31;
  reference pvVar32;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar33;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_00;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> PVar58;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  PVar59;
  XprTypeNested local_b28;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_b20;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_b10;
  Type local_af8;
  Type local_ac0;
  undefined1 local_a88 [8];
  Matrix<float,_4,_4,_0,_4,_4> sol;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_a3b [3];
  Matrix<float,4,4,0,4,4> local_a38 [8];
  Matrix<float,_4,_4,_0,_4,_4> Tw;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_9f0;
  undefined1 local_9d0 [8];
  Matrix<float,_3,_1,_0,_3,_1> t;
  float local_99c;
  Scalar local_998;
  Scalar local_994;
  Scalar local_990;
  float local_98c;
  float local_988;
  Scalar local_984;
  float local_980;
  float local_97c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_978;
  undefined1 local_954 [8];
  Matrix<float,_3,_3,_0,_3,_3> R;
  float tz;
  float s;
  size_t iter;
  vector<float,_std::allocator<float>_> realRoots;
  Matrix<float,_5,_1,_0,_5,_1> factors;
  float e;
  float d;
  float c;
  float b;
  float a;
  float m26;
  float m25;
  float m24;
  float m23;
  float m22;
  float m21;
  float m16;
  float m15;
  float m14;
  float m13;
  float m12;
  float m11;
  float l26;
  float l25;
  float l24;
  float l23;
  float l22;
  float l21;
  float l16;
  float l15;
  float l14;
  float l13;
  float l12;
  float l11;
  RhsNested local_878;
  Matrix<float,6,1,0,6,1> local_870 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU6;
  Matrix<float,6,1,0,6,1> local_848 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU5;
  Matrix<float,6,1,0,6,1> local_820 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU4;
  Matrix<float,6,1,0,6,1> local_7f8 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU3;
  Matrix<float,6,1,0,6,1> local_7d0 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU2;
  Matrix<float,6,1,0,6,1> local_7a8 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU1;
  Type local_758;
  Type local_720;
  Matrix<float,_3,_1,_0,_3,_1> local_6e8;
  Matrix<float,_3,_3,_0,_3,_3> local_6dc;
  NegativeReturnType local_6b8;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_6a8;
  Type local_660;
  Type local_628;
  Type local_5f0;
  Type local_5b8;
  Type local_580;
  Type local_548;
  Type local_510;
  Matrix<float,_3,_1,_0,_3,_1> local_4d8;
  Matrix<float,_3,_3,_0,_3,_3> local_4cc;
  NegativeReturnType local_4a8;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_498;
  Type local_450;
  Type local_418;
  Type local_3e0;
  Type local_3a8;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_36b [3];
  Matrix<float,6,6,0,6,6> local_368 [8];
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_2cb [3];
  Matrix<float,6,6,0,6,6> local_2c8 [8];
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_6,_1,_0,_6,_1> local_1b0;
  Matrix<float,_6,_1,_0,_6,_1> local_198;
  undefined1 local_180 [8];
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  trans;
  undefined1 local_120 [8];
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines3;
  undefined1 local_c0 [8];
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines2;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_98;
  undefined1 local_50 [8];
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines1;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar25 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::size(lCPair);
  if (sVar25 == 0) {
    sVar25 = std::
             vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
             ::size(lPair);
    if (sVar25 < 2) {
      this = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!"
                            );
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
  }
  lines1.
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  pvVar26 = std::
            vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
            ::operator[](lCPair,0);
  std::
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ::pair(&local_98,pvVar26);
  getPluckerCoord<float>
            ((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              *)local_50,&local_98);
  pvVar26 = std::
            vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
            ::operator[](lPair,0);
  std::
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ::pair((pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *)&lines3.
             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar26);
  getPluckerCoord<float>
            ((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              *)local_c0,
             (pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              *)&lines3.
                 super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar26 = std::
            vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
            ::operator[](lPair,1);
  std::
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ::pair((pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *)&trans.
             super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar26);
  getPluckerCoord<float>
            ((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              *)local_120,
             (pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              *)&trans.
                 super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar27 = std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_50,0);
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix(&local_198,pvVar27);
  pvVar27 = std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_50,1);
  Eigen::Matrix<float,_6,_1,_0,_6,_1>::Matrix(&local_1b0,pvVar27);
  getPredefinedTransformations1M1Q<float>
            ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)local_180,&local_198,&local_1b0);
  pvVar28 = std::
            vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          *)local_180,0);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xe),pvVar28);
  pvVar28 = std::
            vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                          *)local_180,1);
  Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<float,_4,_4,_0,_4,_4> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x22),pvVar28);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<float,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            (local_2c8,local_2cb);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::Matrix<float,6,6,0,6,6>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            (local_368,local_36b);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_3a8,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xe),3,3);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
            (&local_3e0,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2c8,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_3e0,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_3a8);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_418,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xe),3,3);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
            (&local_450,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2c8,3,3,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_450,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_418);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_510,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xe),3,1);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
            ((Matrix<float,3,1,0,3,1> *)&local_4d8,
             (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_510);
  getSkew<float>(&local_4cc,&local_4d8);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator-
            (&local_4a8,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_4cc);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_548,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xe),3,3);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
  ::operator*(&local_498,
              (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
               *)&local_4a8,
              (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
              &local_548);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
            (&local_580,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2c8,3,0,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_580,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
              *)&local_498);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_5b8,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x22),3,3);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
            (&local_5f0,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_368,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_5f0,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_5b8);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_628,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x22),3,3);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
            (&local_660,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_368,3,3,3,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_660,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_628);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            (&local_720,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x22),3,1);
  Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
            ((Matrix<float,3,1,0,3,1> *)&local_6e8,
             (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
             &local_720);
  getSkew<float>(&local_6dc,&local_6e8);
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator-
            (&local_6b8,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_6dc);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            (&local_758,
             (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
             (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
              array + 0x22),3,3);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
  ::operator*(&local_6a8,
              (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
               *)&local_6b8,
              (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
              &local_758);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
            ((Type *)(lU1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                      m_data.array + 4),(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_368,3,0,3
             ,3);
  Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)
             (lU1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
             + 4),(DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                   *)&local_6a8);
  pMVar29 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_50,0);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2c8,pMVar29);
  lU2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
       PVar58.m_lhs;
  Eigen::Matrix<float,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            (local_7a8,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)(lU2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 4));
  pMVar29 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_50,1);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_368,pMVar29);
  lU3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
       PVar58.m_lhs;
  Eigen::Matrix<float,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            (local_7d0,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)(lU3.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 4));
  pMVar29 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_c0,0);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2c8,pMVar29);
  lU4.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
       PVar58.m_lhs;
  Eigen::Matrix<float,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            (local_7f8,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)(lU4.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 4));
  pMVar29 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_c0,1);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_368,pMVar29);
  lU5.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
       PVar58.m_lhs;
  Eigen::Matrix<float,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            (local_820,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)(lU5.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 4));
  pMVar29 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_120,0);
  PVar58 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                     ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_2c8,pMVar29);
  lU6.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
       PVar58.m_lhs;
  Eigen::Matrix<float,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            (local_848,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)(lU6.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                 array + 4));
  pMVar29 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_120,1);
  _l12 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                   ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_368,pMVar29);
  Eigen::Matrix<float,6,1,0,6,1>::
  Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            (local_870,
             (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)&l12);
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_7f8,0);
  fVar1 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_7f8,1);
  fVar2 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_7f8,2);
  fVar3 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_7f8,3);
  fVar4 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_7f8,4);
  fVar5 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_7f8,5);
  fVar6 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_848,0);
  fVar7 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_848,1);
  fVar8 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_848,2);
  fVar9 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_848,3);
  fVar10 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_848,4);
  fVar11 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_848,5);
  fVar12 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_820,0);
  fVar13 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_820,1);
  fVar14 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_820,2);
  fVar15 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_820,3);
  fVar16 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_820,4);
  fVar17 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_820,5);
  fVar18 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_870,0);
  fVar19 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_870,1);
  fVar20 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_870,2);
  fVar21 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_870,3);
  fVar22 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_870,4);
  fVar23 = *pSVar30;
  pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_1> *)local_870,5);
  fVar24 = *pSVar30;
  fVar44 = fVar1 + fVar1;
  fVar34 = fVar44 * fVar7;
  fVar48 = (fVar4 + fVar4) * fVar7;
  fVar35 = fVar44 * fVar8;
  fVar36 = fVar2 + fVar2;
  fVar41 = fVar36 * fVar7;
  fVar38 = fVar36 * fVar8;
  fVar56 = (fVar4 + fVar4) * fVar8;
  fVar49 = (fVar5 + fVar5) * fVar7;
  fVar53 = (fVar5 + fVar5) * fVar8;
  fVar50 = fVar1 * 4.0;
  fVar42 = fVar1 + fVar1;
  fVar54 = fVar2 + fVar2;
  fVar51 = fVar2 * 4.0;
  fVar57 = fVar1 + fVar1;
  fVar45 = fVar57 * fVar7;
  fVar43 = (fVar4 + fVar4) * fVar7;
  fVar55 = fVar57 * fVar8;
  fVar37 = fVar2 + fVar2;
  fVar46 = fVar37 * fVar7;
  fVar47 = fVar37 * fVar8;
  fVar39 = (fVar4 + fVar4) * fVar8;
  fVar52 = (fVar5 + fVar5) * fVar7;
  fVar40 = (fVar5 + fVar5) * fVar8;
  Eigen::Matrix<float,_5,_1,_0,_5,_1>::Matrix
            ((Matrix<float,_5,_1,_0,_5,_1> *)
             &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0,0);
  *pSVar31 = fVar6 * fVar8 * fVar15 * fVar19 +
             ((fVar3 * fVar8 * fVar18 * fVar19 +
              ((((fVar1 * fVar12 * fVar14 * fVar21 +
                 fVar1 * fVar9 * fVar14 * fVar24 +
                 ((fVar5 * fVar7 * fVar14 * fVar20 +
                  fVar2 * fVar11 * fVar13 * fVar20 +
                  ((fVar2 * fVar8 * fVar13 * fVar23 +
                   fVar2 * fVar7 * fVar17 * fVar20 +
                   ((((fVar4 * fVar7 * fVar13 * fVar20 +
                      fVar2 * fVar10 * fVar13 * fVar19 +
                      fVar2 * fVar7 * fVar13 * fVar22 +
                      (((fVar1 * fVar7 * fVar16 * fVar20 - fVar1 * fVar7 * fVar14 * fVar22) -
                       fVar1 * fVar8 * fVar16 * fVar19) - fVar1 * fVar10 * fVar14 * fVar19)) -
                     fVar4 * fVar8 * fVar13 * fVar19) - fVar1 * fVar8 * fVar14 * fVar23) -
                   fVar1 * fVar11 * fVar14 * fVar20)) - fVar2 * fVar8 * fVar17 * fVar19)) -
                 fVar5 * fVar8 * fVar14 * fVar19)) - fVar2 * fVar9 * fVar13 * fVar24) -
               fVar2 * fVar12 * fVar13 * fVar21) - fVar3 * fVar7 * fVar18 * fVar20)) -
             fVar6 * fVar7 * fVar15 * fVar20);
  pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,1,0);
  *pSVar31 = ((fVar36 * fVar12 * fVar14 * fVar21 +
              fVar36 * fVar9 * fVar14 * fVar24 +
              ((fVar53 * fVar14 * fVar20 +
               (((fVar38 * fVar17 * fVar20 +
                 ((fVar44 * fVar12 * fVar13 * fVar21 +
                  fVar44 * fVar9 * fVar13 * fVar24 +
                  ((fVar49 * fVar14 * fVar19 +
                   fVar49 * fVar13 * fVar20 +
                   fVar56 * fVar14 * fVar19 +
                   fVar56 * fVar13 * fVar20 +
                   ((fVar36 * fVar11 * fVar13 * fVar19 +
                    ((((fVar38 * fVar13 * fVar22 +
                       fVar41 * fVar17 * fVar19 +
                       fVar41 * fVar16 * fVar20 +
                       (((((fVar44 * fVar10 * fVar14 * fVar20 +
                           fVar35 * fVar17 * fVar19 +
                           fVar35 * fVar16 * fVar20 +
                           ((((fVar34 * fVar14 * fVar23 +
                              fVar48 * fVar13 * fVar19 +
                              ((fVar34 * fVar16 * fVar19 - fVar34 * fVar13 * fVar22) -
                              fVar44 * fVar10 * fVar13 * fVar19)) - fVar34 * fVar17 * fVar20) -
                            fVar35 * fVar13 * fVar23) - fVar35 * fVar14 * fVar22)) -
                          fVar44 * fVar11 * fVar13 * fVar20) - fVar44 * fVar11 * fVar14 * fVar19) -
                        fVar41 * fVar13 * fVar23) - fVar41 * fVar14 * fVar22)) -
                      fVar38 * fVar16 * fVar19) - fVar36 * fVar10 * fVar13 * fVar20) -
                    fVar36 * fVar10 * fVar14 * fVar19)) - fVar48 * fVar14 * fVar20)) -
                  fVar53 * fVar13 * fVar19)) - fVar38 * fVar14 * fVar23)) -
                fVar36 * fVar11 * fVar14 * fVar20) - (fVar3 + fVar3) * fVar7 * fVar18 * fVar19)) -
              (fVar6 + fVar6) * fVar7 * fVar15 * fVar19)) -
             (fVar3 + fVar3) * fVar8 * fVar18 * fVar20) - (fVar6 + fVar6) * fVar8 * fVar15 * fVar20;
  pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,2,0);
  *pSVar31 = (fVar5 + fVar5) * fVar8 * fVar14 * fVar19 +
             fVar5 * 4.0 * fVar8 * fVar13 * fVar20 +
             (((((fVar51 * fVar10 * fVar14 * fVar20 +
                 fVar54 * fVar8 * fVar17 * fVar19 +
                 fVar51 * fVar8 * fVar16 * fVar20 +
                 ((((fVar51 * fVar7 * fVar14 * fVar23 +
                    fVar42 * fVar11 * fVar14 * fVar20 +
                    ((fVar42 * fVar8 * fVar14 * fVar23 +
                     fVar5 * 4.0 * fVar7 * fVar13 * fVar19 +
                     (fVar4 + fVar4) * fVar8 * fVar13 * fVar19 +
                     ((((fVar51 * fVar7 * fVar16 * fVar19 +
                        (((fVar42 * fVar10 * fVar14 * fVar19 +
                          fVar50 * fVar10 * fVar13 * fVar20 +
                          fVar42 * fVar8 * fVar16 * fVar19 +
                          ((((fVar50 * fVar7 * fVar13 * fVar23 + fVar42 * fVar7 * fVar14 * fVar22) -
                            fVar42 * fVar7 * fVar16 * fVar20) - fVar50 * fVar7 * fVar17 * fVar19) -
                          fVar50 * fVar8 * fVar13 * fVar22)) - fVar50 * fVar11 * fVar13 * fVar19) -
                        fVar54 * fVar7 * fVar13 * fVar22)) - fVar54 * fVar10 * fVar13 * fVar19) -
                      (fVar4 + fVar4) * fVar7 * fVar13 * fVar20) -
                     fVar4 * 4.0 * fVar7 * fVar14 * fVar19)) - fVar50 * fVar8 * fVar17 * fVar20)) -
                   fVar54 * fVar7 * fVar17 * fVar20) - fVar54 * fVar8 * fVar13 * fVar23) -
                 fVar51 * fVar8 * fVar14 * fVar22)) - fVar54 * fVar11 * fVar13 * fVar20) -
               fVar51 * fVar11 * fVar14 * fVar19) - fVar4 * 4.0 * fVar8 * fVar14 * fVar20) -
             (fVar5 + fVar5) * fVar7 * fVar14 * fVar20);
  pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,3,0);
  *pSVar31 = ((fVar37 * fVar12 * fVar14 * fVar21 +
              fVar37 * fVar9 * fVar14 * fVar24 +
              ((((fVar37 * fVar11 * fVar14 * fVar20 +
                 ((fVar47 * fVar14 * fVar23 +
                  fVar57 * fVar12 * fVar13 * fVar21 +
                  fVar57 * fVar9 * fVar13 * fVar24 +
                  fVar40 * fVar13 * fVar19 +
                  (((((fVar43 * fVar14 * fVar20 +
                      ((fVar37 * fVar10 * fVar14 * fVar19 +
                       fVar37 * fVar10 * fVar13 * fVar20 +
                       fVar47 * fVar16 * fVar19 +
                       ((((fVar46 * fVar14 * fVar22 +
                          fVar46 * fVar13 * fVar23 +
                          fVar57 * fVar11 * fVar14 * fVar19 +
                          fVar57 * fVar11 * fVar13 * fVar20 +
                          ((((fVar55 * fVar14 * fVar22 +
                             fVar55 * fVar13 * fVar23 +
                             fVar45 * fVar17 * fVar20 +
                             (((fVar57 * fVar10 * fVar13 * fVar19 +
                               (fVar45 * fVar13 * fVar22 - fVar45 * fVar16 * fVar19)) -
                              fVar43 * fVar13 * fVar19) - fVar45 * fVar14 * fVar23)) -
                            fVar55 * fVar16 * fVar20) - fVar55 * fVar17 * fVar19) -
                          fVar57 * fVar10 * fVar14 * fVar20)) - fVar46 * fVar16 * fVar20) -
                        fVar46 * fVar17 * fVar19) - fVar47 * fVar13 * fVar22)) -
                      fVar37 * fVar11 * fVar13 * fVar19)) - fVar39 * fVar13 * fVar20) -
                    fVar39 * fVar14 * fVar19) - fVar52 * fVar13 * fVar20) - fVar52 * fVar14 * fVar19
                  )) - fVar47 * fVar17 * fVar20)) - (fVar3 + fVar3) * fVar7 * fVar18 * fVar19) -
               fVar40 * fVar14 * fVar20) - (fVar6 + fVar6) * fVar7 * fVar15 * fVar19)) -
             (fVar3 + fVar3) * fVar8 * fVar18 * fVar20) - (fVar6 + fVar6) * fVar8 * fVar15 * fVar20;
  pSVar31 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<float,_5,_1,_0,_5,_1>,_1> *)
                       &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,4,0);
  *pSVar31 = (fVar6 * fVar7 * fVar15 * fVar20 +
             ((fVar3 * fVar7 * fVar18 * fVar20 +
              fVar2 * fVar12 * fVar13 * fVar21 +
              fVar2 * fVar9 * fVar13 * fVar24 +
              ((((fVar5 * fVar7 * fVar14 * fVar20 +
                 fVar2 * fVar11 * fVar13 * fVar20 +
                 ((fVar2 * fVar8 * fVar13 * fVar23 +
                  fVar2 * fVar7 * fVar17 * fVar20 +
                  ((((fVar4 * fVar7 * fVar13 * fVar20 +
                     fVar2 * fVar10 * fVar13 * fVar19 +
                     fVar2 * fVar7 * fVar13 * fVar22 +
                     (((fVar1 * fVar7 * fVar16 * fVar20 - fVar1 * fVar7 * fVar14 * fVar22) -
                      fVar1 * fVar8 * fVar16 * fVar19) - fVar1 * fVar10 * fVar14 * fVar19)) -
                    fVar4 * fVar8 * fVar13 * fVar19) - fVar1 * fVar8 * fVar14 * fVar23) -
                  fVar1 * fVar11 * fVar14 * fVar20)) - fVar2 * fVar8 * fVar17 * fVar19)) -
                fVar5 * fVar8 * fVar14 * fVar19) - fVar1 * fVar9 * fVar14 * fVar24) -
              fVar1 * fVar12 * fVar14 * fVar21)) - fVar3 * fVar8 * fVar18 * fVar19)) -
             fVar6 * fVar8 * fVar15 * fVar19;
  o4_roots<float>((vector<float,_std::allocator<float>_> *)&iter,
                  (Matrix<float,_5,_1,_0,_5,_1> *)
                  &realRoots.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  _tz = 0;
  while( true ) {
    sVar25 = std::vector<float,_std::allocator<float>_>::size
                       ((vector<float,_std::allocator<float>_> *)&iter);
    if (sVar25 <= _tz) break;
    pvVar32 = std::vector<float,_std::allocator<float>_>::operator[]
                        ((vector<float,_std::allocator<float>_> *)&iter,_tz);
    R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         *pvVar32;
    R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         -(((fVar4 + fVar4) * fVar14 *
            R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
           + (((fVar1 + fVar1) * fVar17 *
               R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               [8] + fVar6 * fVar15 *
                     R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8] *
                     R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8] +
                     fVar3 * fVar18 *
                     R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8] *
                     R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8] +
                     (((((fVar6 * fVar15 +
                         fVar3 * fVar18 +
                         fVar5 * fVar14 + fVar2 * fVar17 + fVar1 * fVar16 + fVar4 * fVar13) -
                        fVar1 * fVar16 *
                        R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[8] *
                        R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array[8]) -
                       fVar4 * fVar13 *
                       R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array[8] *
                       R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array[8]) -
                      fVar2 * fVar17 *
                      R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8] *
                      R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8]) -
                     fVar5 * fVar14 *
                     R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8] *
                     R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8])) -
             (fVar2 + fVar2) * fVar16 *
             R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
             )) - (fVar5 + fVar5) * fVar13 *
                  R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[8]) /
         ((fVar2 + fVar2) * fVar14 *
          R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] +
         (fVar1 + fVar1) * fVar13 *
         R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] +
         ((fVar1 * fVar14 *
           R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] *
           R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] +
          (fVar2 * fVar13 - fVar1 * fVar14)) -
         fVar2 * fVar13 *
         R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] *
         R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]));
    Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix((Matrix<float,_3,_3,_0,_3,_3> *)local_954);
    local_97c = 1.0 - R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8] *
                      R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8];
    Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
              (&local_978,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_954,&local_97c);
    local_980 = R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [8] * -2.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                        (&local_978,&local_980);
    local_984 = 0.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_984);
    local_988 = R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [8] + R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8];
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_988);
    local_98c = 1.0 - R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8] *
                      R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8];
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_98c);
    local_990 = 0.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_990);
    local_994 = 0.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_994);
    local_998 = 0.0;
    pCVar33 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                        (pCVar33,&local_998);
    local_99c = R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [8] * R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8] + 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar33,&local_99c);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_978);
    t.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         1.0 / (R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
                [8] * R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                      .array[8] + 1.0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                      *)(t.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + 2),
                     t.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array + 1,(StorageBaseType *)local_954);
    Eigen::Matrix<float,3,3,0,3,3>::operator=
              ((Matrix<float,3,3,0,3,3> *)local_954,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                *)(t.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 2));
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix((Matrix<float,_3,_1,_0,_3,_1> *)local_9d0);
    Tw.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] = 0.0
    ;
    Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
              (&local_9f0,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_9d0,
               Tw.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
               + 0xf);
    Tw.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] = 0.0
    ;
    this_00 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                        (&local_9f0,
                         Tw.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                         m_data.array + 0xe);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
              (this_00,R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array + 7);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_9f0);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<float,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              (local_a38,local_a3b);
    Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix((Matrix<float,_4,_4,_0,_4,_4> *)local_a88);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_ac0,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_a38,3,3);
    Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_ac0,
               (DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_954);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              (&local_af8,(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_a38,3,1);
    Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)&local_af8,
               (DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_9d0);
    local_b28 = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                          ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                           (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.
                            m_storage.m_data.array + 0x22));
    PVar59 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                       ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)&local_b28,
                        (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_a38);
    local_b20 = PVar59;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
    ::operator*(&local_b10,
                (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                 *)&local_b20,
                (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                 array + 0xe));
    Eigen::Matrix<float,4,4,0,4,4>::operator=
              ((Matrix<float,4,4,0,4,4> *)local_a88,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                *)&local_b10);
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_a88);
    _tz = _tz + 1;
  }
  lines1.
  super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&iter);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::~vector((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             *)local_180);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             *)local_120);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             *)local_c0);
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             *)local_50);
  if ((lines1.
       super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M2L(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){
	
	// check input vectors size
	if(lCPair.size() < 1 && lPair.size() < 2){
		std::cerr << "Solver 1M2L requires at least 1 line correspondence and 2 line intersections!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;

	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines2 = getPluckerCoord(lPair[0]);
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines3 = getPluckerCoord(lPair[1]);
	

	// move frames to first line and z axis with its direction
	std::vector<Eigen::Matrix<floatPrec,4,4>> trans = getPredefinedTransformations1M1Q(lines1[0],lines1[1]);
	Eigen::Matrix<floatPrec,4,4> TU1 = trans[0], TU2 = trans[1];
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform lines to new frame
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,6,1> lU3 = TUL1*lines2[0];
	Eigen::Matrix<floatPrec,6,1> lU4 = TUL2*lines2[1];
	Eigen::Matrix<floatPrec,6,1> lU5 = TUL1*lines3[0];
	Eigen::Matrix<floatPrec,6,1> lU6 = TUL2*lines3[1];

	// define coeffs
	floatPrec l11 = lU3(0),l12 = lU3(1),l13 = lU3(2),l14 = lU3(3),l15 = lU3(4),l16 = lU3(5);
	floatPrec l21 = lU5(0),l22 = lU5(1),l23 = lU5(2),l24 = lU5(3),l25 = lU5(4),l26 = lU5(5);
	floatPrec m11 = lU4(0),m12 = lU4(1),m13 = lU4(2),m14 = lU4(3),m15 = lU4(4),m16 = lU4(5);
	floatPrec m21 = lU6(0),m22 = lU6(1),m23 = lU6(2),m24 = lU6(3),m25 = lU6(4),m26 = lU6(5);

	floatPrec a = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22     + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 + l11*l23*m12*m26 + l11*l26*m12*m23 - l12*l23*m11*m26 - l12*l26*m11*m23 - l13*l21*m16*m22 + l13*l22*m16*m21 - l16*l21*m13*m22 + l16*l22*m13*m21;
	floatPrec b = 2*l11*l21*m14*m21 - 2*l11*l21*m11*m24 - 2*l11*l24*m11*m21 + 2*l14*l21*m11*m21 + 2*l11*l21*m12*m25 - 2*l11*l21*m15*m22 - 2*l11*l22*m11*m25 - 2*l11*l22*m12*m24 + 2*l11*l22*m14*m22 + 2*l11*l22*m15*m21 + 2*l11*l24*m12*m22 - 2*l11*l25*m11*m22 - 2*l11*l25*m12*m21 - 2*l12*l21*m11*m25 - 2*l12*l21*m12*m24 + 2*l12*l21*m14*m22 + 2*l12*l21*m15*m21 + 2*l12*l22*m11*m24 - 2*l12*l22*m14*m21 - 2*l12*l24*m11*m22 - 2*l12*l24*m12*m21 + 2*l12*l25*m11*m21 - 2*l14*l21*m12*m22 + 2*l14*l22*m11*m22 + 2*l14*l22*m12*m21 + 2*l15*l21*m11*m22 + 2*l15*l21*m12*m21 - 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 - 2*l12*l22*m12*m25 + 2*l12*l22*m15*m22 - 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 + 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec c = 4*l11*l21*m11*m25 + 2*l11*l21*m12*m24 - 2*l11*l21*m14*m22 - 4*l11*l21*m15*m21 - 4*l11*l22*m11*m24 + 2*l11*l22*m14*m21 + 4*l11*l24*m11*m22 + 2*l11*l24*m12*m21 - 4*l11*l25*m11*m21 - 2*l12*l21*m11*m24 + 4*l12*l21*m14*m21 - 2*l12*l24*m11*m21 - 2*l14*l21*m11*m22 - 4*l14*l21*m12*m21 + 2*l14*l22*m11*m21 + 4*l15*l21*m11*m21 + 2*l11*l22*m12*m25 - 4*l11*l22*m15*m22 + 2*l11*l25*m12*m22 + 4*l12*l21*m12*m25 - 2*l12*l21*m15*m22 - 2*l12*l22*m11*m25 - 4*l12*l22*m12*m24 + 4*l12*l22*m14*m22 + 2*l12*l22*m15*m21 + 4*l12*l24*m12*m22 - 2*l12*l25*m11*m22 - 4*l12*l25*m12*m21 - 4*l14*l22*m12*m22 - 2*l15*l21*m12*m22 + 4*l15*l22*m11*m22 + 2*l15*l22*m12*m21; 
	floatPrec d = 2*l11*l21*m11*m24 - 2*l11*l21*m14*m21 + 2*l11*l24*m11*m21 - 2*l14*l21*m11*m21 - 2*l11*l21*m12*m25 + 2*l11*l21*m15*m22 + 2*l11*l22*m11*m25 + 2*l11*l22*m12*m24 - 2*l11*l22*m14*m22 - 2*l11*l22*m15*m21 - 2*l11*l24*m12*m22 + 2*l11*l25*m11*m22 + 2*l11*l25*m12*m21 + 2*l12*l21*m11*m25 + 2*l12*l21*m12*m24 - 2*l12*l21*m14*m22 - 2*l12*l21*m15*m21 - 2*l12*l22*m11*m24 + 2*l12*l22*m14*m21 + 2*l12*l24*m11*m22 + 2*l12*l24*m12*m21 - 2*l12*l25*m11*m21 + 2*l14*l21*m12*m22 - 2*l14*l22*m11*m22 - 2*l14*l22*m12*m21 - 2*l15*l21*m11*m22 - 2*l15*l21*m12*m21 + 2*l15*l22*m11*m21 + 2*l11*l23*m11*m26 + 2*l11*l26*m11*m23 + 2*l12*l22*m12*m25 - 2*l12*l22*m15*m22 + 2*l12*l25*m12*m22 - 2*l13*l21*m16*m21 - 2*l15*l22*m12*m22 - 2*l16*l21*m13*m21 + 2*l12*l23*m12*m26 + 2*l12*l26*m12*m23 - 2*l13*l22*m16*m22 - 2*l16*l22*m13*m22;
	floatPrec e = l11*l21*m14*m22 - l11*l21*m12*m24 - l11*l22*m14*m21 - l11*l24*m12*m21 + l12*l21*m11*m24 + l12*l24*m11*m21 + l14*l21*m11*m22 - l14*l22*m11*m21 - l11*l22*m12*m25 - l11*l25*m12*m22 + l12*l21*m15*m22 + l12*l22*m11*m25 - l12*l22*m15*m21 + l12*l25*m11*m22 + l15*l21*m12*m22 - l15*l22*m12*m21 - l11*l23*m12*m26 - l11*l26*m12*m23 + l12*l23*m11*m26 + l12*l26*m11*m23 + l13*l21*m16*m22 - l13*l22*m16*m21 + l16*l21*m13*m22 - l16*l22*m13*m21;

	// get the roots (will be sTheta)
	Eigen::Matrix<floatPrec, 5, 1> factors;
	factors(0, 0) = a;
	factors(1, 0) = b;
	factors(2, 0) = c;
	factors(3, 0) = d;
	factors(4, 0) = e;
	vector<floatPrec> realRoots = o4_roots(factors);
	for(size_t iter = 0; iter < realRoots.size(); iter++){
		floatPrec s = realRoots[iter];
		
		floatPrec tz = -(l11*m14 + l14*m11 + l12*m15 + l15*m12 + l13*m16 + l16*m13 - l11*m14*s*s - l14*m11*s*s - l12*m15*s*s - l15*m12*s*s + l13*m16*s*s + l16*m13*s*s + 2*l11*m15*s - 2*l12*m14*s + 2*l14*m12*s - 2*l15*m11*s)/(l12*m11 - l11*m12 + l11*m12*s*s - l12*m11*s*s + 2*l11*m11*s + 2*l12*m12*s);

		Eigen::Matrix<floatPrec,3,3> R;
		R << 1-s*s, -2*s, 0, 2*s, 1-s*s, 0, 0, 0, 1+s*s;
		R = 1/(1+s*s)*R;
		Eigen::Matrix<floatPrec,3,1> t;
		t << 0,0,tz;
		Eigen::Matrix<floatPrec,4,4> Tw = Eigen::Matrix<floatPrec,4,4>::Identity(), sol;
		Tw.topLeftCorner(3,3) = R;
		Tw.topRightCorner(3,1) = t;
		sol = TU2.inverse()*Tw*TU1;
		out.push_back(sol);
	}

	return out;
}